

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::returnPressed(QComboBoxPrivate *this)

{
  InsertPolicy IVar1;
  QComboBox *this_00;
  long lVar2;
  long *plVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  MatchFlags flags;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QString local_a8;
  QIcon local_90;
  storage_type_conflict *local_88;
  qsizetype local_80;
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->insertPolicy == NoInsert) || (this->lineEdit == (QLineEdit *)0x0)) goto LAB_003d82c7;
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  QLineEdit::text((QString *)&local_58,this->lineEdit);
  uVar4 = local_58._16_8_;
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if (uVar4 == 0) goto LAB_003d82c7;
  lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
  plVar3 = *(long **)(lVar2 + 0x298);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
  iVar6 = (**(code **)(*plVar3 + 0x78))(plVar3);
  if ((this->maxCount <= iVar6) && (this->insertPolicy != InsertAtCurrent)) goto LAB_003d82c7;
  QLineEdit::deselect(this->lineEdit);
  iVar6 = 0;
  QLineEdit::end(this->lineEdit,false);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,this->lineEdit);
  if ((this->field_0x34c & 2) == 0) {
    flags = matchFlags(this);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_78);
    iVar7 = QComboBox::findData(this_00,(QVariant *)&local_58,0,flags);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (iVar7 == -1) goto LAB_003d804e;
    goto LAB_003d8280;
  }
LAB_003d804e:
  iVar7 = 0;
  switch(this->insertPolicy) {
  case InsertAtTop:
    break;
  case InsertAtCurrent:
  case InsertAfterCurrent:
  case InsertBeforeCurrent:
    lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
    plVar3 = *(long **)(lVar2 + 0x298);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
    iVar8 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
    iVar7 = iVar6;
    if ((iVar8 != 0) && (cVar5 = QPersistentModelIndex::isValid(), cVar5 != '\0')) {
      IVar1 = this->insertPolicy;
      if (IVar1 == InsertBeforeCurrent) {
        iVar7 = QPersistentModelIndex::row();
      }
      else {
        if (IVar1 != InsertAfterCurrent) {
          if (IVar1 == InsertAtCurrent) {
            iVar6 = QPersistentModelIndex::row();
            QComboBox::setItemText(this_00,iVar6,&local_78);
          }
          goto switchD_003d806d_default;
        }
        iVar7 = QPersistentModelIndex::row();
        iVar7 = iVar7 + 1;
      }
      goto LAB_003d8229;
    }
    break;
  case InsertAtBottom:
    iVar7 = QComboBox::count(this_00);
LAB_003d8229:
    if (-1 < iVar7) break;
    goto switchD_003d806d_default;
  case InsertAlphabetically:
    lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
    plVar3 = *(long **)(lVar2 + 0x298);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
    iVar8 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
    iVar7 = iVar6;
    if (0 < iVar8) {
      iVar7 = 0;
      do {
        QString::toLower_helper((QString *)local_58.data);
        QComboBox::itemText(&local_a8,this_00,iVar7);
        QString::toLower_helper((QString *)&local_90);
        QVar9.m_data = local_88;
        QVar9.m_size = local_80;
        QVar10.m_data = (storage_type_conflict *)local_58._8_8_;
        QVar10.m_size = local_58._16_8_;
        iVar6 = QtPrivate::compareStrings(QVar10,QVar9,CaseSensitive);
        if ((QArrayData *)local_90.d != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_90.d = *(int *)local_90.d + -1;
          UNLOCK();
          if (*(int *)local_90.d == 0) {
            QArrayData::deallocate((QArrayData *)local_90.d,2,0x10);
          }
        }
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
          }
        }
        if (iVar6 < 0) break;
        iVar7 = iVar7 + 1;
        lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
        plVar3 = *(long **)(lVar2 + 0x298);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
        iVar6 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
      } while (iVar7 < iVar6);
      goto LAB_003d8229;
    }
    break;
  default:
    goto switchD_003d806d_default;
  }
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = (storage_type_conflict *)0x0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QIcon::QIcon(&local_90);
  QComboBox::insertItem(this_00,iVar7,&local_90,&local_78,(QVariant *)&local_58);
  QIcon::~QIcon(&local_90);
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_003d8280:
  QComboBox::setCurrentIndex(this_00,iVar7);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,&this->currentIndex);
  emitActivated(this,(QModelIndex *)&local_58);
switchD_003d806d_default:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_003d82c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::returnPressed()
{
    Q_Q(QComboBox);

    // The insertion code below does not apply when the policy is QComboBox::NoInsert.
    // In case a completer is installed, item activation via the completer is handled
    // in completerActivated(). Otherwise editingFinished() updates the current
    // index as appropriate.
    if (insertPolicy == QComboBox::NoInsert)
        return;

    if (lineEdit && !lineEdit->text().isEmpty()) {
        if (q->count() >= maxCount && !(this->insertPolicy == QComboBox::InsertAtCurrent))
            return;
        lineEdit->deselect();
        lineEdit->end(false);
        QString text = lineEdit->text();
        // check for duplicates (if not enabled) and quit
        int index = -1;
        if (!duplicatesEnabled) {
            index = q->findText(text, matchFlags());
            if (index != -1) {
                q->setCurrentIndex(index);
                emitActivated(currentIndex);
                return;
            }
        }
        switch (insertPolicy) {
        case QComboBox::InsertAtTop:
            index = 0;
            break;
        case QComboBox::InsertAtBottom:
            index = q->count();
            break;
        case QComboBox::InsertAtCurrent:
        case QComboBox::InsertAfterCurrent:
        case QComboBox::InsertBeforeCurrent:
            if (!q->count() || !currentIndex.isValid())
                index = 0;
            else if (insertPolicy == QComboBox::InsertAtCurrent)
                q->setItemText(q->currentIndex(), text);
            else if (insertPolicy == QComboBox::InsertAfterCurrent)
                index = q->currentIndex() + 1;
            else if (insertPolicy == QComboBox::InsertBeforeCurrent)
                index = q->currentIndex();
            break;
        case QComboBox::InsertAlphabetically:
            index = 0;
            for (int i = 0; i < q->count(); ++i, ++index) {
                if (text.toLower() < q->itemText(i).toLower())
                    break;
            }
            break;
        default:
            break;
        }
        if (index >= 0) {
            q->insertItem(index, text);
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }
}